

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O0

int mg_session_read_run_message(mg_session *session,mg_message_run **message)

{
  mg_session *in_RSI;
  long in_RDI;
  mg_message_run *tmessage;
  mg_map *extra;
  mg_map *parameters;
  int status;
  int status_1;
  mg_string *statement;
  mg_allocator *in_stack_ffffffffffffffb8;
  mg_map *in_stack_ffffffffffffffc0;
  mg_session *in_stack_ffffffffffffffc8;
  mg_value **ppmVar1;
  mg_string **local_30;
  int local_28;
  mg_map **in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = mg_session_read_string
                      (in_stack_ffffffffffffffc8,(mg_string **)in_stack_ffffffffffffffc0);
  if (local_4 == 0) {
    local_28 = mg_session_read_map(in_RSI,in_stack_ffffffffffffffe0);
    if (local_28 == 0) {
      ppmVar1 = (mg_value **)0x0;
      if ((*(int *)(in_RDI + 0x18) != 4) ||
         (local_28 = mg_session_read_map(in_RSI,in_stack_ffffffffffffffe0), local_28 == 0)) {
        in_stack_ffffffffffffffc0 =
             (mg_map *)
             mg_allocator_malloc((mg_allocator *)in_stack_ffffffffffffffc0,
                                 (size_t)in_stack_ffffffffffffffb8);
        if (in_stack_ffffffffffffffc0 != (mg_map *)0x0) {
          *(mg_map ***)in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffe0;
          in_stack_ffffffffffffffc0->keys = local_30;
          in_stack_ffffffffffffffc0->values = ppmVar1;
          *(mg_map **)in_RSI = in_stack_ffffffffffffffc0;
          return 0;
        }
        local_28 = -3;
        mg_map_destroy_ca((mg_map *)0x0,in_stack_ffffffffffffffb8);
      }
      mg_map_destroy_ca(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    else {
      mg_string_destroy_ca((mg_string *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    mg_string_destroy_ca((mg_string *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_4 = local_28;
  }
  return local_4;
}

Assistant:

int mg_session_read_run_message(mg_session *session, mg_message_run **message) {
  mg_string *statement;
  MG_RETURN_IF_FAILED(mg_session_read_string(session, &statement));

  int status = 0;

  mg_map *parameters;
  status = mg_session_read_map(session, &parameters);
  if (status != 0) {
    mg_string_destroy_ca(statement, session->decoder_allocator);
    goto cleanup_statement;
  }

  mg_map *extra = NULL;
  if (session->version == 4) {
    status = mg_session_read_map(session, &extra);
    if (status != 0) {
      goto cleanup_parameters;
    }
  }

  mg_message_run *tmessage =
      mg_allocator_malloc(session->decoder_allocator, sizeof(mg_message_run));
  if (!tmessage) {
    status = MG_ERROR_OOM;
    goto cleanup;
  }

  tmessage->statement = statement;
  tmessage->parameters = parameters;
  tmessage->extra = extra;

  *message = tmessage;
  return 0;

cleanup:
  mg_map_destroy_ca(extra, session->decoder_allocator);

cleanup_parameters:
  mg_map_destroy_ca(parameters, session->decoder_allocator);

cleanup_statement:
  mg_string_destroy_ca(statement, session->decoder_allocator);
  return status;
}